

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s_unittest.cpp
# Opt level: O3

void __thiscall
SortMapSUnitTest_basic_operations_Test::TestBody(SortMapSUnitTest_basic_operations_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  iterator pvVar2;
  char *pcVar3;
  MyMap m;
  AssertHelper local_7e0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d0;
  undefined1 local_7c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  undefined1 local_7a8 [1928];
  pointer local_20;
  bool local_17;
  
  local_20 = (pointer)(local_7a8 + 8);
  local_7a8._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_17 = false;
  local_7d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_7e0.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_7c8,"static_cast<size_t>(0u)","m.size()",(unsigned_long *)&local_7d8,
             (unsigned_long *)&local_7e0);
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_7c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x47,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_7d8._M_head_impl + 8))();
    }
  }
  if (local_7c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7c0,local_7c0);
  }
  local_7c8 = (undefined1  [8])&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key_100","");
  pbVar1 = estl::
           sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           ::operator[]((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                         *)local_7a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7c8);
  std::__cxx11::string::_M_replace((ulong)pbVar1,0,(char *)pbVar1->_M_string_length,0x13e0d4);
  if (local_7c8 != (undefined1  [8])&local_7b8) {
    operator_delete((void *)local_7c8,local_7b8._M_allocated_capacity + 1);
  }
  local_7e0.data_._0_4_ = 1;
  local_7d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8._0_8_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_7c8,"1u","m.size()",(uint *)&local_7e0,(unsigned_long *)&local_7d8);
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_7c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_7d8._M_head_impl + 8))();
    }
  }
  if (local_7c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7c0,local_7c0);
  }
  local_7c8 = (undefined1  [8])&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key_100","");
  pbVar1 = estl::
           sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           ::operator[]((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                         *)local_7a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7c8);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_7d8,"\"val_100\"","m[\"key_100\"]",(char (*) [8])"val_100",pbVar1);
  if (local_7c8 != (undefined1  [8])&local_7b8) {
    operator_delete((void *)local_7c8,local_7b8._M_allocated_capacity + 1);
  }
  if (local_7d8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_7c8);
    if (local_7d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7c8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_7c8 + 8))();
    }
  }
  if (local_7d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7d0,local_7d0);
  }
  local_7c8 = (undefined1  [8])&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key_090","");
  pbVar1 = estl::
           sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           ::operator[]((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                         *)local_7a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7c8);
  std::__cxx11::string::_M_replace((ulong)pbVar1,0,(char *)pbVar1->_M_string_length,0x13e0fb);
  if (local_7c8 != (undefined1  [8])&local_7b8) {
    operator_delete((void *)local_7c8,local_7b8._M_allocated_capacity + 1);
  }
  local_7e0.data_._0_4_ = 2;
  local_7d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8._0_8_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_7c8,"2u","m.size()",(uint *)&local_7e0,(unsigned_long *)&local_7d8);
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_7c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_7d8._M_head_impl + 8))();
    }
  }
  if (local_7c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7c0,local_7c0);
  }
  local_7c8 = (undefined1  [8])&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key_090","");
  pbVar1 = estl::
           sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           ::operator[]((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                         *)local_7a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7c8);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_7d8,"\"val_090\"","m[\"key_090\"]",(char (*) [8])"val_090",pbVar1);
  if (local_7c8 != (undefined1  [8])&local_7b8) {
    operator_delete((void *)local_7c8,local_7b8._M_allocated_capacity + 1);
  }
  if (local_7d8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_7c8);
    if (local_7d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7c8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_7c8 + 8))();
    }
  }
  if (local_7d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7d0,local_7d0);
  }
  local_7c8 = (undefined1  [8])&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key_080","");
  pbVar1 = estl::
           sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           ::operator[]((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                         *)local_7a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7c8);
  std::__cxx11::string::_M_replace((ulong)pbVar1,0,(char *)pbVar1->_M_string_length,0x13e122);
  if (local_7c8 != (undefined1  [8])&local_7b8) {
    operator_delete((void *)local_7c8,local_7b8._M_allocated_capacity + 1);
  }
  local_7e0.data_._0_4_ = 3;
  local_7d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8._0_8_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_7c8,"3u","m.size()",(uint *)&local_7e0,(unsigned_long *)&local_7d8);
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_7c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_7d8._M_head_impl + 8))();
    }
  }
  if (local_7c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7c0,local_7c0);
  }
  local_7c8 = (undefined1  [8])&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key_080","");
  pbVar1 = estl::
           sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           ::operator[]((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                         *)local_7a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7c8);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_7d8,"\"val_080\"","m[\"key_080\"]",(char (*) [8])"val_080",pbVar1);
  if (local_7c8 != (undefined1  [8])&local_7b8) {
    operator_delete((void *)local_7c8,local_7b8._M_allocated_capacity + 1);
  }
  if (local_7d8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_7c8);
    if (local_7d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x53,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7c8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_7c8 + 8))();
    }
  }
  if (local_7d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7d0,local_7d0);
  }
  local_7c8 = (undefined1  [8])&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key_180","");
  pbVar1 = estl::
           sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           ::operator[]((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                         *)local_7a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7c8);
  std::__cxx11::string::_M_replace((ulong)pbVar1,0,(char *)pbVar1->_M_string_length,0x13e14c);
  if (local_7c8 != (undefined1  [8])&local_7b8) {
    operator_delete((void *)local_7c8,local_7b8._M_allocated_capacity + 1);
  }
  local_7e0.data_._0_4_ = 4;
  local_7d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a8._0_8_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_7c8,"4u","m.size()",(uint *)&local_7e0,(unsigned_long *)&local_7d8);
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_7c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_7d8._M_head_impl + 8))();
    }
  }
  if (local_7c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7c0,local_7c0);
  }
  local_7c8 = (undefined1  [8])&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key_180","");
  pbVar1 = estl::
           sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           ::operator[]((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                         *)local_7a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_7c8);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_7d8,"\"val_180\"","m[\"key_180\"]",(char (*) [8])"val_180",pbVar1);
  if (local_7c8 != (undefined1  [8])&local_7b8) {
    operator_delete((void *)local_7c8,local_7b8._M_allocated_capacity + 1);
  }
  if (local_7d8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_7c8);
    if (local_7d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x57,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7c8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_7c8 + 8))();
    }
  }
  if (local_7d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7d0,local_7d0);
  }
  local_7c8 = (undefined1  [8])&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"key_090","");
  pvVar2 = estl::
           sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           ::do_find((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                      *)local_7a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8)
  ;
  if (local_7c8 != (undefined1  [8])&local_7b8) {
    operator_delete((void *)local_7c8,local_7b8._M_allocated_capacity + 1);
  }
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)local_7c8,"\"val_090\"","it->second",(char (*) [8])"val_090",
             &pvVar2->second);
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_7c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_7c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if (local_7d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_7d8._M_head_impl + 8))();
    }
  }
  if (local_7c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7c0,local_7c0);
  }
  estl::
  vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
  ::destroy_elements((vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
                      *)local_7a8);
  return;
}

Assistant:

TEST_F(SortMapSUnitTest, basic_operations)
{
    using MyMap = estl::sort_map_s<std::string, std::string, 30>;
    MyMap m;

    EXPECT_EQ(static_cast<size_t>(0u), m.size());

    m["key_100"] = "val_100";
    EXPECT_EQ(1u, m.size());
    EXPECT_EQ("val_100", m["key_100"]);

    m["key_090"] = "val_090";
    EXPECT_EQ(2u, m.size());
    EXPECT_EQ("val_090", m["key_090"]);

    m["key_080"] = "val_080";
    EXPECT_EQ(3u, m.size());
    EXPECT_EQ("val_080", m["key_080"]);

    m["key_180"] = "val_180";
    EXPECT_EQ(4u, m.size());
    EXPECT_EQ("val_180", m["key_180"]);

    auto it = m.find("key_090");
    EXPECT_EQ("val_090", it->second);
}